

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgmesh.cpp
# Opt level: O2

void __thiscall TPZGeoMesh::RestoreReference(TPZGeoMesh *this,TPZCompMesh *cmesh)

{
  TPZCompEl *this_00;
  TPZCompEl **ppTVar1;
  TPZGeoEl *pTVar2;
  long lVar3;
  long nelem;
  
  ResetReference(this);
  this->fReference = cmesh;
  lVar3 = (cmesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
  nelem = 0;
  if (lVar3 < 1) {
    lVar3 = nelem;
  }
  do {
    if (lVar3 == nelem) {
      return;
    }
    ppTVar1 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                        (&(cmesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>,nelem);
    this_00 = *ppTVar1;
    if (this_00 != (TPZCompEl *)0x0) {
      pTVar2 = TPZCompEl::Reference(this_00);
      if (pTVar2 == (TPZGeoEl *)0x0) {
        std::operator<<((ostream *)&std::cerr,
                        "RestoreReference incomplete. Exist computational element with geometrical\n"
                       );
        std::operator<<((ostream *)&std::cerr,
                        "element not belongs to the current geometrical mesh.\n");
        return;
      }
      pTVar2->fReference = this_00;
    }
    nelem = nelem + 1;
  } while( true );
}

Assistant:

void TPZGeoMesh::RestoreReference(TPZCompMesh *cmesh)
{
	ResetReference();
	fReference = cmesh;
	TPZGeoEl *gel;
	TPZCompEl *cel;
	int64_t i,nelem = cmesh->ElementVec().NElements();
	for(i=0;i<nelem;i++)
	{
		cel = cmesh->ElementVec()[i];
		if(cel)
		{
			gel = cel->Reference();
			if(!gel)
			{
				PZError << "RestoreReference incomplete. Exist computational element with geometrical\n";
				PZError << "element not belongs to the current geometrical mesh.\n";
				return;
			}
			gel->SetReference(cel);
		}
	}
}